

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::Psbt::CreateRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *prefix,uint8_t sub_type,
          ByteData *sub_key_bytes)

{
  ByteData local_a0;
  ByteData local_88;
  ByteData local_60;
  ByteData local_48;
  ByteData *local_30;
  ByteData *sub_key_bytes_local;
  ByteData *pBStack_20;
  uint8_t sub_type_local;
  ByteData *prefix_local;
  ByteData *pBStack_10;
  uint8_t type_local;
  
  local_30 = sub_key_bytes;
  sub_key_bytes_local._7_1_ = sub_type;
  pBStack_20 = prefix;
  prefix_local._7_1_ = type;
  pBStack_10 = __return_storage_ptr__;
  ByteData::ByteData(&local_48,type);
  ByteData::Serialize(&local_60,pBStack_20);
  ByteData::ByteData(&local_88,sub_key_bytes_local._7_1_);
  ByteData::Serialize(&local_a0,local_30);
  ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
            (__return_storage_ptr__,&local_48,&local_60,&local_88,&local_a0);
  ByteData::~ByteData(&local_a0);
  ByteData::~ByteData(&local_88);
  ByteData::~ByteData(&local_60);
  ByteData::~ByteData(&local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(
    uint8_t type, const ByteData &prefix, uint8_t sub_type,
    const ByteData &sub_key_bytes) {
  return ByteData(type).Concat(
      prefix.Serialize(), ByteData(sub_type), sub_key_bytes.Serialize());
}